

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::polyline
          (ImGuiDrawListGraphicsAdaptor *this,
          vector<nivalis::point,_std::allocator<nivalis::point>_> *points,color *c,float thickness,
          bool closed,bool fill)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  byte in_CL;
  vector<nivalis::point,_std::allocator<nivalis::point>_> *in_RSI;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *in_RDI;
  byte in_R8B;
  float in_stack_00000008;
  bool in_stack_0000000f;
  ImU32 in_stack_00000010;
  int in_stack_00000014;
  point *in_stack_00000018;
  ImDrawList *in_stack_00000020;
  value_type k;
  value_type j;
  value_type i;
  size_t t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  point *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<nivalis::point,_std::allocator<nivalis::point>_> *__range2;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  poly;
  vector<nivalis::point,_std::allocator<nivalis::point>_> *in_stack_fffffffffffffe68;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
  *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  ImVec2 *in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  ImVec2 *p1;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  value_type_conflict5 _x;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  value_type local_a4;
  value_type local_a0;
  value_type local_9c;
  ulong local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  float local_78;
  float local_74;
  point *local_70;
  point *local_68;
  __normal_iterator<const_nivalis::point_*,_std::vector<nivalis::point,_std::allocator<nivalis::point>_>_>
  local_60;
  vector<nivalis::point,_std::allocator<nivalis::point>_> *local_58;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  local_38;
  byte local_1e;
  byte local_1d;
  vector<nivalis::point,_std::allocator<nivalis::point>_> *local_10;
  
  local_1d = in_CL & 1;
  local_1e = in_R8B & 1;
  local_10 = in_RSI;
  if (local_1e == 0) {
    pvVar8 = std::vector<nivalis::point,_std::allocator<nivalis::point>_>::operator[](in_RSI,0);
    sVar4 = std::vector<nivalis::point,_std::allocator<nivalis::point>_>::size(local_10);
    ImColor::ImColor((ImColor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,(float)sVar4,
                     (float)((ulong)pvVar8 >> 0x20),SUB84(pvVar8,0));
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x19716d);
    ImDrawList::AddPolyline<nivalis::point>
              (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
               in_stack_0000000f,in_stack_00000008);
  }
  else {
    std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
    allocator((allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
               *)0x196c01);
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,(allocator_type *)in_stack_fffffffffffffe80);
    std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
    ~allocator((allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                *)0x196c2a);
    local_58 = local_10;
    local_60._M_current =
         (point *)std::vector<nivalis::point,_std::allocator<nivalis::point>_>::begin
                            (in_stack_fffffffffffffe68);
    local_68 = (point *)std::vector<nivalis::point,_std::allocator<nivalis::point>_>::end
                                  (in_stack_fffffffffffffe68);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_nivalis::point_*,_std::vector<nivalis::point,_std::allocator<nivalis::point>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<const_nivalis::point_*,_std::vector<nivalis::point,_std::allocator<nivalis::point>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar3) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<const_nivalis::point_*,_std::vector<nivalis::point,_std::allocator<nivalis::point>_>_>
                 ::operator*(&local_60);
      std::
      vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
      ::operator[](&local_38,0);
      local_78 = point::operator[](local_70,0);
      local_74 = point::operator[](local_70,1);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                (in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
      __gnu_cxx::
      __normal_iterator<const_nivalis::point_*,_std::vector<nivalis::point,_std::allocator<nivalis::point>_>_>
      ::operator++(&local_60);
    }
    mapbox::
    earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
              (in_RDI);
    local_98 = 0;
    while( true ) {
      uVar2 = local_98;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_90);
      if (sVar4 <= uVar2) break;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_90,local_98);
      local_9c = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_90,local_98 + 1);
      local_a0 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_90,local_98 + 2);
      local_a4 = *pvVar5;
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](&local_38,0);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_9c);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      fVar1 = *pvVar7;
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](&local_38,0);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_9c);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      ImVec2::ImVec2(&local_ac,fVar1,*pvVar7);
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](&local_38,0);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_a0);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      fVar1 = *pvVar7;
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](&local_38,0);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_a0);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      ImVec2::ImVec2(&local_b4,fVar1,*pvVar7);
      p1 = (ImVec2 *)0x0;
      in_stack_fffffffffffffe80 = (ImVec2 *)&local_38;
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[]((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                             *)in_stack_fffffffffffffe80,0);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_a4);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      _x = *pvVar7;
      pvVar6 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[]((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                             *)in_stack_fffffffffffffe80,(size_type)p1);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (pvVar6,(ulong)local_a4);
      pvVar7 = std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      ImVec2::ImVec2(&local_bc,_x,*pvVar7);
      ImColor::ImColor((ImColor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       in_stack_fffffffffffffe78,(float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       SUB84(in_stack_fffffffffffffe70,0));
      in_stack_fffffffffffffe7c = (float)ImColor::operator_cast_to_unsigned_int((ImColor *)0x19703f)
      ;
      ImDrawList::AddTriangleFilled
                ((ImDrawList *)CONCAT44(_x,in_stack_fffffffffffffe90),p1,in_stack_fffffffffffffe80,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (ImU32)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      local_98 = local_98 + 3;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe80);
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               *)in_stack_fffffffffffffe80);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::polyline(const std::vector<point>& points,
                                            const color::color& c,
                                            float thickness, bool closed,
                                            bool fill) {
    if (fill) {
        std::vector<std::vector<ECPoint>> poly(1);
        for (auto& p : points) poly[0].push_back({p[0], p[1]});
        std::vector<ECInt> indices = mapbox::earcut<ECInt>(poly);
        for (size_t t = 0; t < indices.size(); t += 3) {
            const auto i = indices[t], j = indices[t + 1], k = indices[t + 2];
            draw_list->AddTriangleFilled(ImVec2(poly[0][i][0], poly[0][i][1]),
                                         ImVec2(poly[0][j][0], poly[0][j][1]),
                                         ImVec2(poly[0][k][0], poly[0][k][1]),
                                         ImColor(c.r, c.g, c.b, c.a));
        }
    } else {
        draw_list->AddPolyline<point>(&points[0], points.size(),
                                      ImColor(c.r, c.g, c.b, c.a), closed,
                                      thickness);
    }
}